

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O1

void qsound_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  qsound_state *chip;
  
  uVar1 = *(uint *)((long)info + 0x250);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)info + 0x248)),data,__n);
  return;
}

Assistant:

static void qsound_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	qsound_state* chip = (qsound_state *)info;
	
	if (offset > chip->sample_rom_length)
		return;
	if (offset + length > chip->sample_rom_length)
		length = chip->sample_rom_length - offset;
	
	memcpy(chip->sample_rom + offset, data, length);
	
	return;
}